

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGlaOld.c
# Opt level: O2

void Gla_ManRefSelect_rec(Gla_Man_t *p,Gia_Obj_t *pObj,int f,Vec_Int_t *vSelect,int Sign)

{
  Rfn_Obj_t RVar1;
  Rfn_Obj_t RVar2;
  int iVar3;
  uint uVar4;
  Rfn_Obj_t *pRVar5;
  Rfn_Obj_t *pRVar6;
  Rfn_Obj_t *pRVar7;
  ulong uVar8;
  Gia_Obj_t *pGVar9;
  uint uVar10;
  
LAB_004a01f4:
  pRVar5 = Gla_ObjRef(p,pObj,f);
  if (((uint)*pRVar5 & 2) == 0) {
    if (p->pPars->fPropFanout == 0) {
      RVar2 = (Rfn_Obj_t)((uint)*pRVar5 | 2);
      *pRVar5 = RVar2;
    }
    else {
      Gia_ManRefSetAndPropFanout_rec(p,pObj,f,vSelect,Sign);
      RVar2 = *pRVar5;
    }
    if (((uint)RVar2 & 4) == 0) {
      iVar3 = Gia_ObjIsPi(p->pGia,pObj);
      if (iVar3 != 0) {
        return;
      }
      if ((~*(ulong *)pObj & 0x1fffffff1fffffff) == 0) {
        return;
      }
      iVar3 = Gia_ObjIsRo(p->pGia,pObj);
      if (iVar3 == 0) {
        if (((int)(uint)*(undefined8 *)pObj < 0) ||
           (uVar4 = (uint)*(undefined8 *)pObj & 0x1fffffff, uVar4 == 0x1fffffff)) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absGlaOld.c"
                        ,0x1a5,
                        "void Gla_ManRefSelect_rec(Gla_Man_t *, Gia_Obj_t *, int, Vec_Int_t *, int)"
                       );
        }
        pRVar6 = Gla_ObjRef(p,pObj + -(ulong)uVar4,f);
        pRVar7 = Gla_ObjRef(p,pObj + -(ulong)(*(uint *)&pObj->field_0x4 & 0x1fffffff),f);
        RVar2 = *pRVar6;
        if (((uint)*pRVar5 & 1) == 0) {
          uVar8 = *(ulong *)pObj;
          RVar1 = *pRVar7;
          uVar4 = (uint)(uVar8 >> 0x3d) ^ (uint)RVar1;
          if ((((uint)(uVar8 >> 0x1d) & 7 ^ (uint)RVar2) & 1) == 0) {
            if ((uVar4 & 1) == 0) {
              uVar4 = (uint)RVar2 >> 3 & 0xffff;
              uVar10 = (uint)RVar1 >> 3 & 0xffff;
              if (uVar10 < uVar4) {
                if (uVar10 == 0) {
                  return;
                }
                goto LAB_004a037b;
              }
            }
            else {
              uVar4 = (uint)RVar2 & 0x7fff8;
            }
            if (uVar4 == 0) {
              return;
            }
          }
          else {
            if ((uVar4 & 1) != 0) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absGlaOld.c"
                            ,0x1a2,
                            "void Gla_ManRefSelect_rec(Gla_Man_t *, Gia_Obj_t *, int, Vec_Int_t *, int)"
                           );
            }
            if (((uint)RVar1 & 0x7fff8) == 0) {
              return;
            }
LAB_004a037b:
            uVar8 = uVar8 >> 0x20;
          }
        }
        else {
          if (((uint)RVar2 & 0x7fff8) != 0) {
            Gla_ManRefSelect_rec
                      (p,pObj + -(ulong)((uint)*(undefined8 *)pObj & 0x1fffffff),f,vSelect,Sign);
          }
          if (((uint)*pRVar7 & 0x7fff8) == 0) {
            return;
          }
          uVar8 = (ulong)*(uint *)&pObj->field_0x4;
        }
        pObj = pObj + -(ulong)((uint)uVar8 & 0x1fffffff);
      }
      else {
        if (f < 1) {
          return;
        }
        pGVar9 = Gia_ObjRoToRi(p->pGia,pObj);
        pObj = pGVar9 + -(ulong)((uint)*(undefined8 *)pGVar9 & 0x1fffffff);
        f = f + -1;
      }
      goto LAB_004a01f4;
    }
    if (((uint)RVar2 & 0x7fff8) == 0) {
      __assert_fail("(int)pRef->Prio > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absGlaOld.c"
                    ,0x168,
                    "void Gla_ManRefSelect_rec(Gla_Man_t *, Gia_Obj_t *, int, Vec_Int_t *, int)");
    }
    if (p->pPars->fPropFanout == 0) {
      iVar3 = Gia_ObjId(p->pGia,pObj);
      Vec_IntPush(vSelect,iVar3);
      Vec_IntAddToEntry(p->vObjCounts,f,1);
      return;
    }
    for (iVar3 = p->pPars->iFrame; -1 < iVar3; iVar3 = iVar3 + -1) {
      pRVar5 = Gla_ObjRef(p,pObj,iVar3);
      if (((uint)*pRVar5 & 2) == 0) {
        Gia_ManRefSetAndPropFanout_rec(p,pObj,iVar3,vSelect,Sign);
      }
    }
  }
  return;
}

Assistant:

void Gla_ManRefSelect_rec( Gla_Man_t * p, Gia_Obj_t * pObj, int f, Vec_Int_t * vSelect, int Sign )
{ 
    int i;//, Id = Gia_ObjId(p->pGia, pObj);
    Rfn_Obj_t * pRef = Gla_ObjRef( p, pObj, f );
//    assert( (int)pRef->Sign == Sign );
    if ( pRef->fVisit )
        return;
    if ( p->pPars->fPropFanout )
        Gia_ManRefSetAndPropFanout_rec( p, pObj, f, vSelect, Sign );
    else
        pRef->fVisit = 1;
    if ( pRef->fPPi )
    {
        assert( (int)pRef->Prio > 0 );
        if ( p->pPars->fPropFanout )
        {
            for ( i = p->pPars->iFrame; i >= 0; i-- )
                if ( !Gla_ObjRef(p, pObj, i)->fVisit )
                    Gia_ManRefSetAndPropFanout_rec( p, pObj, i, vSelect, Sign );
        }
        else
        {
            Vec_IntPush( vSelect, Gia_ObjId(p->pGia, pObj) );
            Vec_IntAddToEntry( p->vObjCounts, f, 1 );
        }
        return;
    }
    if ( Gia_ObjIsPi(p->pGia, pObj) || Gia_ObjIsConst0(pObj) )
        return;
    if ( Gia_ObjIsRo(p->pGia, pObj) )
    {
        if ( f > 0 )
            Gla_ManRefSelect_rec( p, Gia_ObjFanin0(Gia_ObjRoToRi(p->pGia, pObj)), f-1, vSelect, Sign );
        return;
    }
    if ( Gia_ObjIsAnd(pObj) )
    {
        Rfn_Obj_t * pRef0 = Gla_ObjRef( p, Gia_ObjFanin0(pObj), f );
        Rfn_Obj_t * pRef1 = Gla_ObjRef( p, Gia_ObjFanin1(pObj), f );
        if ( pRef->Value == 1 )
        {
            if ( pRef0->Prio > 0 )
                Gla_ManRefSelect_rec( p, Gia_ObjFanin0(pObj), f, vSelect, Sign );
            if ( pRef1->Prio > 0 )
                Gla_ManRefSelect_rec( p, Gia_ObjFanin1(pObj), f, vSelect, Sign );
        }
        else // select one value
        {
            if ( (pRef0->Value ^ Gia_ObjFaninC0(pObj)) == 0 && (pRef1->Value ^ Gia_ObjFaninC1(pObj)) == 0 )
            {
                if ( pRef0->Prio <= pRef1->Prio ) // choice
                {
                    if ( pRef0->Prio > 0 )
                        Gla_ManRefSelect_rec( p, Gia_ObjFanin0(pObj), f, vSelect, Sign );
                }
                else
                {
                    if ( pRef1->Prio > 0 )
                        Gla_ManRefSelect_rec( p, Gia_ObjFanin1(pObj), f, vSelect, Sign );
                }
            }
            else if ( (pRef0->Value ^ Gia_ObjFaninC0(pObj)) == 0 )
            {
                if ( pRef0->Prio > 0 )
                    Gla_ManRefSelect_rec( p, Gia_ObjFanin0(pObj), f, vSelect, Sign );
            }
            else if ( (pRef1->Value ^ Gia_ObjFaninC1(pObj)) == 0 )
            {
                if ( pRef1->Prio > 0 )
                    Gla_ManRefSelect_rec( p, Gia_ObjFanin1(pObj), f, vSelect, Sign );
            }
            else assert( 0 );
        }
    }
    else assert( 0 );
}